

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O1

void test_bson_utf8_get_char(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  size_t sVar5;
  undefined8 unaff_RBX;
  char **ppcVar6;
  int iStack_1c;
  short sStack_16;
  char cStack_14;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x135c18;
  iVar2 = bson_utf8_get_char("asdf");
  if (iVar2 == 0x61) {
    pcStack_10 = (code *)0x135c2d;
    unaff_RBX = bson_utf8_next_char("asdf");
    pcStack_10 = (code *)0x135c38;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x73) goto LAB_00135d36;
    pcStack_10 = (code *)0x135c49;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x135c54;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 100) goto LAB_00135d3b;
    pcStack_10 = (code *)0x135c65;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x135c70;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x66) goto LAB_00135d40;
    pcStack_10 = (code *)0x135c81;
    pcVar3 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar3 != '\0') goto LAB_00135d45;
    pcStack_10 = (code *)0x135c96;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2);
    if (iVar2 != 0x20ac) goto LAB_00135d4a;
    pcStack_10 = (code *)0x135cad;
    puVar4 = (uchar *)bson_utf8_next_char(test_bson_utf8_get_char::test2);
    if (puVar4 != test_bson_utf8_get_char::test2 + 3) goto LAB_00135d4f;
    pcStack_10 = (code *)0x135cc9;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2 + 3);
    if (iVar2 != 0x20) goto LAB_00135d54;
    pcStack_10 = (code *)0x135cde;
    unaff_RBX = bson_utf8_next_char(test_bson_utf8_get_char::test2 + 3);
    pcStack_10 = (code *)0x135ce9;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00135d59;
    pcStack_10 = (code *)0x135cf8;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x135d03;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20) goto LAB_00135d5e;
    pcStack_10 = (code *)0x135d10;
    unaff_RBX = bson_utf8_next_char(unaff_RBX);
    pcStack_10 = (code *)0x135d1b;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00135d63;
    pcStack_10 = (code *)0x135d2a;
    pcVar3 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar3 == '\0') {
      return;
    }
  }
  else {
    pcStack_10 = (code *)0x135d36;
    test_bson_utf8_get_char_cold_1();
LAB_00135d36:
    pcStack_10 = (code *)0x135d3b;
    test_bson_utf8_get_char_cold_2();
LAB_00135d3b:
    pcStack_10 = (code *)0x135d40;
    test_bson_utf8_get_char_cold_3();
LAB_00135d40:
    pcStack_10 = (code *)0x135d45;
    test_bson_utf8_get_char_cold_4();
LAB_00135d45:
    pcStack_10 = (code *)0x135d4a;
    test_bson_utf8_get_char_cold_5();
LAB_00135d4a:
    pcStack_10 = (code *)0x135d4f;
    test_bson_utf8_get_char_cold_6();
LAB_00135d4f:
    pcStack_10 = (code *)0x135d54;
    test_bson_utf8_get_char_cold_7();
LAB_00135d54:
    pcStack_10 = (code *)0x135d59;
    test_bson_utf8_get_char_cold_8();
LAB_00135d59:
    pcStack_10 = (code *)0x135d5e;
    test_bson_utf8_get_char_cold_9();
LAB_00135d5e:
    pcStack_10 = (code *)0x135d63;
    test_bson_utf8_get_char_cold_10();
LAB_00135d63:
    pcStack_10 = (code *)0x135d68;
    test_bson_utf8_get_char_cold_11();
  }
  pcStack_10 = test_bson_utf8_from_unichar;
  test_bson_utf8_get_char_cold_12();
  pcStack_10 = (code *)unaff_RBX;
  bson_utf8_from_unichar(0,&sStack_16,&iStack_1c);
  if (iStack_1c == 1) {
    bson_utf8_from_unichar(0x80,&sStack_16,&iStack_1c);
    if (iStack_1c != 2) goto LAB_0013602c;
    bson_utf8_from_unichar(0x800,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_00136031;
    bson_utf8_from_unichar(0x10000,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_00136036;
    bson_utf8_from_unichar(0x200000,&sStack_16,&iStack_1c);
    if (iStack_1c != 5) goto LAB_0013603b;
    bson_utf8_from_unichar(0x4000000,&sStack_16,&iStack_1c);
    if (iStack_1c != 6) goto LAB_00136040;
    bson_utf8_from_unichar(0x7f,&sStack_16,&iStack_1c);
    if (iStack_1c != 1) goto LAB_00136045;
    bson_utf8_from_unichar(0x7ff,&sStack_16,&iStack_1c);
    if (iStack_1c != 2) goto LAB_0013604a;
    bson_utf8_from_unichar(0xffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_0013604f;
    bson_utf8_from_unichar(0x1fffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_00136054;
    bson_utf8_from_unichar(0x3ffffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 5) goto LAB_00136059;
    bson_utf8_from_unichar(0x7fffffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 6) goto LAB_0013605e;
    bson_utf8_from_unichar(0xd7ff,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_00136063;
    bson_utf8_from_unichar(0xe000,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_00136068;
    bson_utf8_from_unichar(0xfffd,&sStack_16,&iStack_1c);
    if (iStack_1c != 3) goto LAB_0013606d;
    bson_utf8_from_unichar(0x10ffff,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_00136072;
    bson_utf8_from_unichar(0x110000,&sStack_16,&iStack_1c);
    if (iStack_1c != 4) goto LAB_00136077;
    bson_utf8_from_unichar(0x61,&sStack_16,&iStack_1c);
    if (iStack_1c != 1) goto LAB_0013607c;
    if ((char)sStack_16 != 'a') goto LAB_00136081;
    bson_utf8_from_unichar(0xff,&sStack_16,&iStack_1c);
    if (iStack_1c != 2) goto LAB_00136086;
    if (sStack_16 != -0x403d) goto LAB_0013608b;
    bson_utf8_from_unichar(0x20ac,&sStack_16,&iStack_1c);
    if (iStack_1c == 3) {
      if (cStack_14 == -0x54 && sStack_16 == -0x7d1e) {
        return;
      }
      goto LAB_00136095;
    }
  }
  else {
    test_bson_utf8_from_unichar_cold_1();
LAB_0013602c:
    test_bson_utf8_from_unichar_cold_2();
LAB_00136031:
    test_bson_utf8_from_unichar_cold_3();
LAB_00136036:
    test_bson_utf8_from_unichar_cold_4();
LAB_0013603b:
    test_bson_utf8_from_unichar_cold_5();
LAB_00136040:
    test_bson_utf8_from_unichar_cold_6();
LAB_00136045:
    test_bson_utf8_from_unichar_cold_7();
LAB_0013604a:
    test_bson_utf8_from_unichar_cold_8();
LAB_0013604f:
    test_bson_utf8_from_unichar_cold_9();
LAB_00136054:
    test_bson_utf8_from_unichar_cold_10();
LAB_00136059:
    test_bson_utf8_from_unichar_cold_11();
LAB_0013605e:
    test_bson_utf8_from_unichar_cold_12();
LAB_00136063:
    test_bson_utf8_from_unichar_cold_13();
LAB_00136068:
    test_bson_utf8_from_unichar_cold_14();
LAB_0013606d:
    test_bson_utf8_from_unichar_cold_15();
LAB_00136072:
    test_bson_utf8_from_unichar_cold_16();
LAB_00136077:
    test_bson_utf8_from_unichar_cold_17();
LAB_0013607c:
    test_bson_utf8_from_unichar_cold_18();
LAB_00136081:
    test_bson_utf8_from_unichar_cold_19();
LAB_00136086:
    test_bson_utf8_from_unichar_cold_20();
LAB_0013608b:
    test_bson_utf8_from_unichar_cold_21();
  }
  test_bson_utf8_from_unichar_cold_22();
LAB_00136095:
  test_bson_utf8_from_unichar_cold_23();
  ppcVar6 = test_bson_utf8_non_shortest::tests;
  puVar4 = (uchar *)0x0;
  do {
    pcVar3 = *ppcVar6;
    sVar5 = strlen(pcVar3);
    cVar1 = bson_utf8_validate(pcVar3,sVar5,0);
    if (cVar1 != '\0') {
      test_bson_utf8_non_shortest_cold_2();
      goto LAB_001360f9;
    }
    puVar4 = (uchar *)((long)&((TestSuite *)puVar4)->prgname + 1);
    ppcVar6 = ppcVar6 + 1;
  } while ((TestSuite *)puVar4 != (TestSuite *)0x5);
  puVar4 = test_bson_utf8_validate::test2;
  cVar1 = bson_utf8_validate(test_bson_utf8_validate::test2,2,1);
  if (cVar1 != '\0') {
    return;
  }
LAB_001360f9:
  test_bson_utf8_non_shortest_cold_1();
  TestSuite_Add((TestSuite *)puVar4,"/bson/value/basic",test_value_basic);
  TestSuite_Add((TestSuite *)puVar4,"/bson/value/decimal128",test_value_decimal128);
  return;
}

Assistant:

static void
test_bson_utf8_get_char (void)
{
   static const char *test1 = "asdf";
   static const unsigned char test2[] = {
      0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, ' ', 0xe2, 0x82, 0xac, 0};
   const char *c;

   c = test1;
   BSON_ASSERT (bson_utf8_get_char (c) == 'a');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 's');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'd');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 'f');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);

   c = (const char *) test2;
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (c == (const char *) test2 + 3);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == ' ');
   c = bson_utf8_next_char (c);
   BSON_ASSERT (bson_utf8_get_char (c) == 0x20AC);
   c = bson_utf8_next_char (c);
   BSON_ASSERT (!*c);
}